

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O2

vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *
BitSetsFromSets<512ul>
          (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *__return_storage_ptr__,
          vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *names)

{
  _WordT *p_Var1;
  pointer puVar2;
  mapped_type *pmVar3;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *set;
  pointer puVar4;
  __node_base *p_Var5;
  bitset<512UL> x;
  
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.super__Base_bitset<8UL>._M_w[0] = 0;
  x.super__Base_bitset<8UL>._M_w[1] = 0;
  x.super__Base_bitset<8UL>._M_w[2] = 0;
  x.super__Base_bitset<8UL>._M_w[3] = 0;
  x.super__Base_bitset<8UL>._M_w[4] = 0;
  x.super__Base_bitset<8UL>._M_w[5] = 0;
  x.super__Base_bitset<8UL>._M_w[6] = 0;
  x.super__Base_bitset<8UL>._M_w[7] = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT416(0) << 0x40,0);
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT416(0) << 0x40,8);
  std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::reserve
            (__return_storage_ptr__,
             ((long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(sets->
                   super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38);
  puVar2 = (sets->
           super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (sets->
                super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    p_Var5 = &(puVar4->_M_h)._M_before_begin;
    x.super__Base_bitset<8UL>._M_w[0] = 0;
    x.super__Base_bitset<8UL>._M_w[1] = 0;
    x.super__Base_bitset<8UL>._M_w[2] = 0;
    x.super__Base_bitset<8UL>._M_w[3] = 0;
    x.super__Base_bitset<8UL>._M_w[4] = 0;
    x.super__Base_bitset<8UL>._M_w[5] = 0;
    x.super__Base_bitset<8UL>._M_w[6] = 0;
    x.super__Base_bitset<8UL>._M_w[7] = 0;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)names,(key_type *)(p_Var5 + 1));
      p_Var1 = x.super__Base_bitset<8UL>._M_w + (*pmVar3 >> 6);
      *p_Var1 = *p_Var1 | 1L << (*pmVar3 & 0x3f);
    }
    std::vector<std::bitset<512ul>,std::allocator<std::bitset<512ul>>>::
    emplace_back<std::bitset<512ul>&>
              ((vector<std::bitset<512ul>,std::allocator<std::bitset<512ul>>> *)
               __return_storage_ptr__,&x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::bitset<n_entities>> BitSetsFromSets(
        const std::vector<Set>& sets,
        const std::unordered_map<std::string, size_t>& names)
{
    std::bitset<n_entities> x;
    std::vector<std::bitset<n_entities>> binary_sets;
    binary_sets.reserve(sets.size());
    for (const auto& set : sets)
    {
        x.reset();
        for (const auto& elem : set)
            x[names.at(elem)] = true;
        binary_sets.emplace_back(x);
    }
    return binary_sets;
}